

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefineVarCommand.cpp
# Opt level: O0

double __thiscall DefineVarCommand::execute(DefineVarCommand *this)

{
  bool bVar1;
  reference pvVar2;
  size_type sVar3;
  Variable *pVVar4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
  *pmVar5;
  MathInterpreter *pMVar6;
  reference __rhs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>,_bool>
  pVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  MathInterpreter *local_168;
  MathInterpreter *mi;
  undefined1 local_158;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>
  local_150;
  undefined1 local_121;
  string local_120;
  _Base_ptr local_100;
  undefined1 local_f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>
  local_f0;
  _Base_ptr local_c8;
  undefined1 local_c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>
  local_b8;
  undefined1 local_89;
  string local_88;
  string local_68;
  string local_38;
  Variable *local_18;
  Variable *v;
  DefineVarCommand *this_local;
  
  v = (Variable *)this;
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&this->type_data,0);
  bVar1 = std::operator==(pvVar2,"var");
  if (!bVar1) {
    printf("failed definning var : wrong input");
    return 0.0;
  }
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&this->type_data,2);
  bVar1 = std::operator==(pvVar2,"->");
  if (!bVar1) {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->type_data,2);
    bVar1 = std::operator==(pvVar2,"<-");
    if (!bVar1) goto LAB_001190cf;
  }
  pVVar4 = (Variable *)operator_new(0x70);
  local_89 = 1;
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&this->type_data,1);
  std::__cxx11::string::string((string *)&local_38,(string *)pvVar2);
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&this->type_data,2);
  std::__cxx11::string::string((string *)&local_68,(string *)pvVar2);
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&this->type_data,4);
  std::__cxx11::string::string((string *)&local_88,(string *)pvVar2);
  Variable::Variable(pVVar4,&local_38,&local_68,&local_88);
  local_89 = 0;
  local_18 = pVVar4;
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_38);
  pmVar5 = DataBase::getInVarMap_abi_cxx11_(d);
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&this->type_data,1);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_Variable_*&,_true>
            (&local_b8,pvVar2,&local_18);
  pVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
          ::insert(pmVar5,&local_b8);
  local_c8 = (_Base_ptr)pVar7.first._M_node;
  local_c0 = pVar7.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>
  ::~pair(&local_b8);
  pmVar5 = DataBase::getSimVarMap_abi_cxx11_(d);
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&this->type_data,4);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_Variable_*&,_true>
            (&local_f0,pvVar2,&local_18);
  pVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
          ::insert(pmVar5,&local_f0);
  local_100 = (_Base_ptr)pVar7.first._M_node;
  local_f8 = pVar7.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>
  ::~pair(&local_f0);
LAB_001190cf:
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&this->type_data,2);
  bVar1 = std::operator==(pvVar2,"=");
  if ((bVar1) &&
     (sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->type_data), sVar3 == 4)) {
    pVVar4 = (Variable *)operator_new(0x70);
    local_121 = 1;
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->type_data,1);
    std::__cxx11::string::string((string *)&local_120,(string *)pvVar2);
    Variable::Variable(pVVar4,&local_120);
    local_121 = 0;
    local_18 = pVVar4;
    std::__cxx11::string::~string((string *)&local_120);
    pmVar5 = DataBase::getInVarMap_abi_cxx11_(d);
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->type_data,1);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_Variable_*&,_true>
              (&local_150,pvVar2,&local_18);
    pVar7 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
            ::insert(pmVar5,&local_150);
    mi = (MathInterpreter *)pVar7.first._M_node;
    local_158 = pVar7.second;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>
    ::~pair(&local_150);
    pMVar6 = (MathInterpreter *)operator_new(0x20);
    pmVar5 = DataBase::getInVarMap_abi_cxx11_(d);
    MathInterpreter::MathInterpreter(pMVar6,pmVar5);
    this_00 = &this->type_data;
    local_168 = pMVar6;
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](this_00,1);
    __rhs = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](this_00,2);
    std::operator+(&local_1a8,pvVar2,__rhs);
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](this_00,3);
    std::operator+(&local_188,&local_1a8,pvVar2);
    MathInterpreter::insertVariables(pMVar6,&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_1a8);
    pMVar6 = local_168;
    if (local_168 != (MathInterpreter *)0x0) {
      MathInterpreter::~MathInterpreter(local_168);
      operator_delete(pMVar6,0x20);
    }
  }
  return 0.0;
}

Assistant:

double DefineVarCommand::execute() {
  if (!(this->type_data[0] == "var")) {
    printf("failed definning var : wrong input");
  } else {
    Variable *v;
    if ((this->type_data[2] == "->") || (this->type_data[2] == "<-")) {
      v = new Variable(type_data[1], type_data[2], type_data[4]);
      d->getInVarMap()->insert({this->type_data[1], v});
      d->getSimVarMap()->insert({this->type_data[4], v});
    }
    if ((this->type_data[2] == "=") && (this->type_data.size() == 4)) {
      v = new Variable(this->type_data[1]);
      d->getInVarMap()->insert({this->type_data[1], v});
      MathInterpreter *mi = new MathInterpreter(d->getInVarMap());
      mi->insertVariables(type_data[1] + type_data[2] + type_data[3]);
      delete mi;
    }
  }
  return 0;
}